

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# at_application.h
# Opt level: O2

void __thiscall MessageCracker::process(MessageCracker *this,Message *message,SessionID *sessionID)

{
  bool bVar1;
  ClOrdID *__a;
  iterator iVar2;
  PossResend possResend;
  pair<FIX::ClOrdID,_FIX::SessionID> pair;
  Message echo;
  FieldBase local_370;
  pair<FIX::ClOrdID,_FIX::SessionID> local_318;
  Message local_170 [344];
  
  FIX::Message::Message(local_170,message);
  local_318.first.super_StringField.super_FieldBase._vptr_FieldBase._0_1_ = 0;
  FIX::PossResend::PossResend((PossResend *)&local_370,(BOOLEAN *)&local_318);
  FIX::FieldMap::getFieldIfSet((FieldMap *)(message + 0x70),&local_370);
  __a = FIX::FieldMap::getField<FIX::ClOrdID>((FieldMap *)message);
  std::pair<FIX::ClOrdID,_FIX::SessionID>::pair<FIX::ClOrdID,_FIX::SessionID,_true>
            (&local_318,__a,sessionID);
  bVar1 = FIX::BoolField::getValue((BoolField *)&local_370);
  if (bVar1) {
    iVar2 = std::
            _Rb_tree<std::pair<FIX::ClOrdID,_FIX::SessionID>,_std::pair<FIX::ClOrdID,_FIX::SessionID>,_std::_Identity<std::pair<FIX::ClOrdID,_FIX::SessionID>_>,_std::less<std::pair<FIX::ClOrdID,_FIX::SessionID>_>,_std::allocator<std::pair<FIX::ClOrdID,_FIX::SessionID>_>_>
            ::find(&(this->m_orderIDs)._M_t,&local_318);
    if ((_Rb_tree_header *)iVar2._M_node != &(this->m_orderIDs)._M_t._M_impl.super__Rb_tree_header)
    goto LAB_00128bca;
  }
  std::
  _Rb_tree<std::pair<FIX::ClOrdID,FIX::SessionID>,std::pair<FIX::ClOrdID,FIX::SessionID>,std::_Identity<std::pair<FIX::ClOrdID,FIX::SessionID>>,std::less<std::pair<FIX::ClOrdID,FIX::SessionID>>,std::allocator<std::pair<FIX::ClOrdID,FIX::SessionID>>>
  ::_M_insert_unique<std::pair<FIX::ClOrdID,FIX::SessionID>const&>
            ((_Rb_tree<std::pair<FIX::ClOrdID,FIX::SessionID>,std::pair<FIX::ClOrdID,FIX::SessionID>,std::_Identity<std::pair<FIX::ClOrdID,FIX::SessionID>>,std::less<std::pair<FIX::ClOrdID,FIX::SessionID>>,std::allocator<std::pair<FIX::ClOrdID,FIX::SessionID>>>
              *)&this->m_orderIDs,&local_318);
  FIX::Session::sendToTarget(local_170,sessionID);
LAB_00128bca:
  std::pair<FIX::ClOrdID,_FIX::SessionID>::~pair(&local_318);
  FIX::FieldBase::~FieldBase(&local_370);
  FIX::Message::~Message(local_170);
  return;
}

Assistant:

void process(const FIX::Message &message, const FIX::SessionID &sessionID) {
    FIX::Message echo = message;
    FIX::PossResend possResend(false);
    message.getHeader().getFieldIfSet(possResend);

    auto const &clOrdID = message.getField<FIX::ClOrdID>();

    std::pair<FIX::ClOrdID, FIX::SessionID> pair = std::make_pair(clOrdID, sessionID);

    if (possResend == true) {
      if (m_orderIDs.find(pair) != m_orderIDs.end()) {
        return;
      }
    }
    m_orderIDs.insert(pair);
    FIX::Session::sendToTarget(echo, sessionID);
  }